

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void memXor(void *dest,void *src1,void *src2,size_t count)

{
  size_t count_local;
  void *src2_local;
  void *src1_local;
  void *dest_local;
  
  src2_local = src2;
  src1_local = src1;
  dest_local = dest;
  for (count_local = count; 7 < count_local; count_local = count_local - 8) {
    *(ulong *)dest_local = *src1_local ^ *src2_local;
    src1_local = (void *)((long)src1_local + 8);
    src2_local = (void *)((long)src2_local + 8);
    dest_local = (void *)((long)dest_local + 8);
  }
  while (count_local != 0) {
    *(byte *)dest_local = *src1_local ^ *src2_local;
    src1_local = (void *)((long)src1_local + 1);
    src2_local = (void *)((long)src2_local + 1);
    dest_local = (void *)((long)dest_local + 1);
    count_local = count_local - 1;
  }
  return;
}

Assistant:

void memXor(void* dest, const void* src1, const void* src2, size_t count)
{
	ASSERT(memIsSameOrDisjoint(src1, dest, count));
	ASSERT(memIsSameOrDisjoint(src2, dest, count));
	for (; count >= O_PER_W; count -= O_PER_W)
	{
		*(word*)dest = *(const word*)src1 ^ *(const word*)src2;
		src1 = (const word*)src1 + 1;
		src2 = (const word*)src2 + 1;
		dest = (word*)dest + 1;
	}
	while (count--)
	{
		*(octet*)dest = *(const octet*)src1 ^ *(const octet*)src2;
		src1 = (const octet*)src1 + 1;
		src2 = (const octet*)src2 + 1;
		dest = (octet*)dest + 1;
	}
}